

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

uint __thiscall
ON_MeshComponentRef::GetMeshTopologyEdgeAndLine
          (ON_MeshComponentRef *this,ON_MeshTopologyEdge **tope,ON_Line *line)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ON_MeshTopologyEdge *pOVar6;
  ON_MeshTopologyVertex *pOVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  uint uVar13;
  ON_MeshTopology *pOVar14;
  ON_3dPointListRef vlist;
  ON_3dPointListRef local_40;
  
  *tope = (ON_MeshTopologyEdge *)0x0;
  uVar13 = GetMeshTopologyEdge(this,tope);
  if ((((uVar13 != 0xffffffff) && (pOVar6 = *tope, pOVar6 != (ON_MeshTopologyEdge *)0x0)) &&
      (-1 < pOVar6->m_topvi[0])) &&
     ((-1 < pOVar6->m_topvi[1] && (pOVar14 = MeshTopology(this), pOVar14 != (ON_MeshTopology *)0x0))
     )) {
    iVar1 = (pOVar14->m_topv).m_count;
    iVar2 = (*tope)->m_topvi[0];
    if ((iVar2 < iVar1) && (iVar3 = (*tope)->m_topvi[1], iVar3 < iVar1)) {
      pOVar7 = (pOVar14->m_topv).m_a;
      if ((0 < pOVar7[iVar2].m_v_count) && (0 < pOVar7[iVar3].m_v_count)) {
        if (pOVar7[iVar2].m_vi != (int *)0x0) {
          if ((((uint *)pOVar7[iVar3].m_vi != (uint *)0x0) &&
              (iVar1 = *pOVar7[iVar2].m_vi, -1 < iVar1)) &&
             (uVar4 = *pOVar7[iVar3].m_vi, -1 < (int)uVar4)) {
            uVar5 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
            if ((iVar1 < (int)uVar5) && (uVar4 < uVar5)) {
              ON_3dPointListRef::ON_3dPointListRef(&local_40,this->m_mesh);
              ON_3dPointListRef::GetPoint(&local_40,*pOVar7[iVar2].m_vi,(double *)line);
              ON_3dPointListRef::GetPoint(&local_40,*pOVar7[iVar3].m_vi,&(line->to).x);
              return uVar13;
            }
          }
        }
      }
    }
  }
  dVar12 = ON_Line::UnsetLine.to.z;
  dVar11 = ON_Line::UnsetLine.to.x;
  dVar10 = ON_Line::UnsetLine.from.z;
  dVar9 = ON_Line::UnsetLine.from.y;
  dVar8 = ON_Line::UnsetLine.from.x;
  (line->to).y = ON_Line::UnsetLine.to.y;
  (line->to).z = dVar12;
  (line->from).z = dVar10;
  (line->to).x = dVar11;
  (line->from).x = dVar8;
  (line->from).y = dVar9;
  return uVar13;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshTopologyEdgeAndLine(
  const struct ON_MeshTopologyEdge*& tope,
  ON_Line& line 
  ) const
{
  tope = 0;
  unsigned int topei = GetMeshTopologyEdge(tope);
  if ( ON_UNSET_UINT_INDEX != topei && 0 != tope && tope->m_topvi[0] >= 0 && tope->m_topvi[1] >= 0 )
  {
    const ON_MeshTopology* top = MeshTopology();
    if ( 0 != top )
    {
      int topv_count = top->m_topv.Count();
      if ( tope->m_topvi[0] < topv_count && tope->m_topvi[1] < topv_count )
      {
        const ON_MeshTopologyVertex& v0 = top->m_topv[tope->m_topvi[0]];
        const ON_MeshTopologyVertex& v1 = top->m_topv[tope->m_topvi[1]];
        if ( v0.m_v_count > 0 && v1.m_v_count > 0 && 0 != v0.m_vi && 0 != v1.m_vi )
        {
          if ( v0.m_vi[0] >= 0 && v1.m_vi[0] >= 0 && v0.m_vi[0] < m_mesh->m_V.Count() && v1.m_vi[0] < m_mesh->m_V.Count() )
          {
            ON_3dPointListRef vlist(m_mesh);
            vlist.GetPoint(v0.m_vi[0],&line.from.x);
            vlist.GetPoint(v1.m_vi[0],&line.to.x);
            return topei;
          }
        }
      }
    }
  }

  line = ON_Line::UnsetLine;
  return topei;
}